

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O0

void gmath::svd(Matrixd *a,Matrixd *U,Vectord *W,Matrixd *V,bool thin)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  int *piVar5;
  double *pdVar6;
  DMatrix<double> *in_RCX;
  DVector<double> *in_RDX;
  DMatrix<double> *in_RSI;
  DVector<double> *pDVar7;
  byte in_R8B;
  double __x;
  double dVar8;
  double __x_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double __x_01;
  double __x_02;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined4 in_XMM1_Da;
  undefined4 uVar14;
  undefined4 in_XMM1_Db;
  undefined4 uVar15;
  int i_26;
  int i_25;
  double t_8;
  int i_24;
  int i_23;
  int i_22;
  double sn_2;
  double cs_2;
  double t_7;
  int j_8;
  double g;
  double f_2;
  double shift;
  double c;
  double b;
  double ek;
  double sk;
  double epm1;
  double spm1;
  double sp;
  double scale;
  int i_21;
  double sn_1;
  double cs_1;
  double t_6;
  int j_7;
  double f_1;
  int i_20;
  double sn;
  double cs;
  double t_5;
  int j_6;
  double f;
  double t_4;
  int ks;
  int kase;
  int k_3;
  double tiny;
  double eps;
  int iter;
  int pp;
  int i_19;
  int i_18;
  int i_17;
  double t_3;
  int j_5;
  int k_2;
  int i_16;
  int i_15;
  int i_14;
  int i_13;
  int i_12;
  double t_2;
  int j_4;
  int k_1;
  int i_11;
  int j_3;
  int p;
  int i_10;
  int i_9;
  double t_1;
  int j_2;
  int i_8;
  int j_1;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  double t;
  int j;
  int i_1;
  int i;
  int k;
  int lu;
  int nrt;
  int nct;
  Vectord work;
  Vectord e;
  int ncu;
  int n;
  int m;
  Matrixd A;
  bool wantv;
  bool wantu;
  int in_stack_fffffffffffff38c;
  DMatrix<double> *in_stack_fffffffffffff390;
  DMatrix<double> *in_stack_fffffffffffff398;
  DMatrix<double> *in_stack_fffffffffffff3a0;
  double local_ba0;
  double local_6d8;
  double local_6b8;
  uint local_2b4;
  int local_290;
  int local_28c;
  int local_27c;
  int local_278;
  int local_274;
  int local_254;
  double local_250;
  double local_248;
  double local_240;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  int local_1cc;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  int local_1ac;
  double local_1a8;
  int local_19c;
  double local_198;
  double local_190;
  double local_188;
  int local_17c;
  double local_178;
  double local_170;
  int local_164;
  undefined4 local_160;
  int local_15c;
  double local_158;
  double local_150;
  int local_144;
  int local_140;
  int local_13c;
  uint local_138;
  uint local_134;
  double local_130;
  uint local_124;
  uint local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  double local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  double local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  double local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94 [3];
  int local_88;
  int local_84;
  DVector<double> local_80;
  DVector<double> local_70;
  int local_60;
  uint local_5c;
  uint local_58 [5];
  uint local_44;
  DMatrix<double> local_40;
  undefined1 local_23;
  undefined1 local_22;
  byte local_21;
  DMatrix<double> *local_20;
  DVector<double> *local_18;
  DMatrix<double> *local_10;
  
  local_21 = in_R8B & 1;
  local_22 = 1;
  local_23 = 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  DMatrix<double>::DMatrix(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
  local_44 = DMatrix<double>::rows(&local_40);
  local_58[0] = DMatrix<double>::cols(&local_40);
  if ((local_21 & 1) == 0) {
    local_2b4 = local_44;
  }
  else {
    puVar4 = (uint *)std::min<int>((int *)&local_44,(int *)local_58);
    local_2b4 = *puVar4;
  }
  local_5c = local_2b4;
  DMatrix<double>::init(local_10,(EVP_PKEY_CTX *)(ulong)local_44);
  DMatrix<double>::operator=(local_10,0.0);
  pDVar7 = local_18;
  local_60 = local_44 + 1;
  puVar4 = (uint *)std::min<int>(&local_60,(int *)local_58);
  DVector<double>::init(pDVar7,(EVP_PKEY_CTX *)(ulong)*puVar4);
  DMatrix<double>::init(local_20,(EVP_PKEY_CTX *)(ulong)local_58[0]);
  DMatrix<double>::operator=(local_20,0.0);
  DVector<double>::DVector((DVector<double> *)in_stack_fffffffffffff390,in_stack_fffffffffffff38c);
  DVector<double>::DVector((DVector<double> *)in_stack_fffffffffffff390,in_stack_fffffffffffff38c);
  local_88 = local_44 - 1;
  piVar5 = std::min<int>(&local_88,(int *)local_58);
  local_84 = *piVar5;
  local_94[1] = 0;
  local_94[0] = local_58[0] - 2;
  piVar5 = std::min<int>(local_94,(int *)&local_44);
  piVar5 = std::max<int>(local_94 + 1,piVar5);
  local_94[2] = *piVar5;
  piVar5 = std::max<int>(&local_84,local_94 + 2);
  local_98 = *piVar5;
  for (local_9c = 0; local_9c < local_98; local_9c = local_9c + 1) {
    iVar2 = local_9c;
    if (local_9c < local_84) {
      pdVar6 = DVector<double>::operator[](local_18,local_9c);
      *pdVar6 = 0.0;
      for (local_a0 = local_9c; local_a0 < (int)local_44; local_a0 = local_a0 + 1) {
        DVector<double>::operator[](local_18,local_9c);
        DMatrix<double>::operator()(&local_40,local_a0,local_9c);
        dVar8 = anon_unknown_20::hypot(__x,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
        pdVar6 = DVector<double>::operator[](local_18,local_9c);
        *pdVar6 = dVar8;
      }
      pdVar6 = DVector<double>::operator[](local_18,local_9c);
      if ((*pdVar6 != 0.0) || (NAN(*pdVar6))) {
        pdVar6 = DMatrix<double>::operator()(&local_40,local_9c,local_9c);
        if (*pdVar6 <= 0.0 && *pdVar6 != 0.0) {
          pdVar6 = DVector<double>::operator[](local_18,local_9c);
          dVar8 = *pdVar6;
          pdVar6 = DVector<double>::operator[](local_18,local_9c);
          *pdVar6 = -dVar8;
        }
        for (local_a4 = local_9c; local_a4 < (int)local_44; local_a4 = local_a4 + 1) {
          pdVar6 = DVector<double>::operator[](local_18,local_9c);
          dVar8 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(&local_40,local_a4,local_9c);
          *pdVar6 = *pdVar6 / dVar8;
        }
        pdVar6 = DMatrix<double>::operator()(&local_40,local_9c,local_9c);
        *pdVar6 = *pdVar6 + 1.0;
      }
      pdVar6 = DVector<double>::operator[](local_18,local_9c);
      dVar8 = *pdVar6;
      in_XMM1_Da = 0;
      in_XMM1_Db = 0x80000000;
      pdVar6 = DVector<double>::operator[](local_18,local_9c);
      *pdVar6 = -dVar8;
      iVar2 = local_9c;
    }
    while (local_a8 = iVar2 + 1, local_a8 < (int)local_58[0]) {
      bVar1 = local_9c < local_84;
      pdVar6 = DVector<double>::operator[](local_18,local_9c);
      in_XMM1_Da = 0;
      in_XMM1_Db = 0;
      if (bVar1 && *pdVar6 != 0.0) {
        local_b0 = 0.0;
        for (local_b4 = local_9c; dVar8 = local_b0, local_b4 < (int)local_44;
            local_b4 = local_b4 + 1) {
          pdVar6 = DMatrix<double>::operator()(&local_40,local_b4,local_9c);
          dVar8 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(&local_40,local_b4,local_a8);
          local_b0 = dVar8 * *pdVar6 + local_b0;
        }
        in_XMM1_Da = 0;
        in_XMM1_Db = 0x80000000;
        pdVar6 = DMatrix<double>::operator()(&local_40,local_9c,local_9c);
        local_b0 = -dVar8 / *pdVar6;
        for (local_b8 = local_9c; dVar8 = local_b0, local_b8 < (int)local_44;
            local_b8 = local_b8 + 1) {
          pdVar6 = DMatrix<double>::operator()(&local_40,local_b8,local_9c);
          dVar9 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(&local_40,local_b8,local_a8);
          dVar10 = *pdVar6;
          in_XMM1_Da = SUB84(dVar10,0);
          in_XMM1_Db = (undefined4)((ulong)dVar10 >> 0x20);
          *pdVar6 = dVar8 * dVar9 + dVar10;
        }
      }
      pdVar6 = DMatrix<double>::operator()(&local_40,local_9c,local_a8);
      dVar8 = *pdVar6;
      pdVar6 = DVector<double>::operator[](&local_70,local_a8);
      *pdVar6 = dVar8;
      iVar2 = local_a8;
    }
    if (local_9c < local_84) {
      for (local_bc = local_9c; local_bc < (int)local_44; local_bc = local_bc + 1) {
        pdVar6 = DMatrix<double>::operator()(&local_40,local_bc,local_9c);
        dVar8 = *pdVar6;
        pdVar6 = DMatrix<double>::operator()(local_10,local_bc,local_9c);
        *pdVar6 = dVar8;
      }
    }
    if (local_9c < local_94[2]) {
      pdVar6 = DVector<double>::operator[](&local_70,local_9c);
      *pdVar6 = 0.0;
      local_c0 = local_9c;
      while (local_c0 = local_c0 + 1, local_c0 < (int)local_58[0]) {
        DVector<double>::operator[](&local_70,local_9c);
        DVector<double>::operator[](&local_70,local_c0);
        dVar8 = anon_unknown_20::hypot(__x_00,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
        pdVar6 = DVector<double>::operator[](&local_70,local_9c);
        *pdVar6 = dVar8;
      }
      pdVar6 = DVector<double>::operator[](&local_70,local_9c);
      if ((*pdVar6 != 0.0) || (NAN(*pdVar6))) {
        pdVar6 = DVector<double>::operator[](&local_70,local_9c + 1);
        iVar2 = local_9c;
        if (*pdVar6 <= 0.0 && *pdVar6 != 0.0) {
          pdVar6 = DVector<double>::operator[](&local_70,local_9c);
          dVar8 = *pdVar6;
          pdVar6 = DVector<double>::operator[](&local_70,local_9c);
          *pdVar6 = -dVar8;
          iVar2 = local_9c;
        }
        while (local_c4 = iVar2 + 1, local_c4 < (int)local_58[0]) {
          pdVar6 = DVector<double>::operator[](&local_70,local_9c);
          dVar8 = *pdVar6;
          pdVar6 = DVector<double>::operator[](&local_70,local_c4);
          *pdVar6 = *pdVar6 / dVar8;
          iVar2 = local_c4;
        }
        pdVar6 = DVector<double>::operator[](&local_70,local_9c + 1);
        *pdVar6 = *pdVar6 + 1.0;
      }
      pdVar6 = DVector<double>::operator[](&local_70,local_9c);
      dVar8 = *pdVar6;
      pdVar6 = DVector<double>::operator[](&local_70,local_9c);
      *pdVar6 = -dVar8;
      bVar1 = local_9c + 1 < (int)local_44;
      pdVar6 = DVector<double>::operator[](&local_70,local_9c);
      in_XMM1_Da = 0;
      in_XMM1_Db = 0;
      iVar2 = local_9c;
      if (bVar1 && *pdVar6 != 0.0) {
        while (local_c8 = iVar2 + 1, iVar2 = local_9c, local_c8 < (int)local_44) {
          pdVar6 = DVector<double>::operator[](&local_80,local_c8);
          *pdVar6 = 0.0;
          iVar2 = local_c8;
        }
        while (local_cc = iVar2 + 1, iVar2 = local_9c, local_cc < (int)local_58[0]) {
          while (local_d0 = iVar2 + 1, iVar2 = local_cc, local_d0 < (int)local_44) {
            pdVar6 = DVector<double>::operator[](&local_70,local_cc);
            dVar8 = *pdVar6;
            pdVar6 = DMatrix<double>::operator()(&local_40,local_d0,local_cc);
            dVar9 = *pdVar6;
            pdVar6 = DVector<double>::operator[](&local_80,local_d0);
            dVar10 = *pdVar6;
            in_XMM1_Da = SUB84(dVar10,0);
            in_XMM1_Db = (undefined4)((ulong)dVar10 >> 0x20);
            *pdVar6 = dVar8 * dVar9 + dVar10;
            iVar2 = local_d0;
          }
        }
        while (local_d4 = iVar2 + 1, iVar2 = local_9c, local_d4 < (int)local_58[0]) {
          pdVar6 = DVector<double>::operator[](&local_70,local_d4);
          dVar8 = *pdVar6;
          in_XMM1_Da = 0;
          in_XMM1_Db = 0x80000000;
          pdVar6 = DVector<double>::operator[](&local_70,local_9c + 1);
          local_e0 = -dVar8 / *pdVar6;
          local_e4 = local_9c;
          while (dVar8 = local_e0, local_e4 = local_e4 + 1, iVar2 = local_d4,
                local_e4 < (int)local_44) {
            pdVar6 = DVector<double>::operator[](&local_80,local_e4);
            dVar9 = *pdVar6;
            pdVar6 = DMatrix<double>::operator()(&local_40,local_e4,local_d4);
            dVar10 = *pdVar6;
            in_XMM1_Da = SUB84(dVar10,0);
            in_XMM1_Db = (undefined4)((ulong)dVar10 >> 0x20);
            *pdVar6 = dVar8 * dVar9 + dVar10;
          }
        }
      }
      while (local_e8 = iVar2 + 1, local_e8 < (int)local_58[0]) {
        pdVar6 = DVector<double>::operator[](&local_70,local_e8);
        dVar8 = *pdVar6;
        pdVar6 = DMatrix<double>::operator()(local_20,local_e8,local_9c);
        *pdVar6 = dVar8;
        iVar2 = local_e8;
      }
    }
  }
  local_f0 = local_44 + 1;
  piVar5 = std::min<int>((int *)local_58,&local_f0);
  local_ec = *piVar5;
  if (local_84 < (int)local_58[0]) {
    pdVar6 = DMatrix<double>::operator()(&local_40,local_84,local_84);
    dVar8 = *pdVar6;
    pdVar6 = DVector<double>::operator[](local_18,local_84);
    *pdVar6 = dVar8;
  }
  if ((int)local_44 < local_ec) {
    pdVar6 = DVector<double>::operator[](local_18,local_ec + -1);
    *pdVar6 = 0.0;
  }
  if (local_94[2] + 1 < local_ec) {
    pdVar6 = DMatrix<double>::operator()(&local_40,local_94[2],local_ec + -1);
    dVar8 = *pdVar6;
    pdVar6 = DVector<double>::operator[](&local_70,local_94[2]);
    *pdVar6 = dVar8;
  }
  pdVar6 = DVector<double>::operator[](&local_70,local_ec + -1);
  *pdVar6 = 0.0;
  for (local_f4 = local_84; local_fc = local_84, local_f4 < (int)local_5c; local_f4 = local_f4 + 1)
  {
    for (local_f8 = 0; local_f8 < (int)local_44; local_f8 = local_f8 + 1) {
      pdVar6 = DMatrix<double>::operator()(local_10,local_f8,local_f4);
      *pdVar6 = 0.0;
    }
    pdVar6 = DMatrix<double>::operator()(local_10,local_f4,local_f4);
    *pdVar6 = 1.0;
  }
  while (local_fc = local_fc + -1, local_120 = local_58[0], -1 < local_fc) {
    pdVar6 = DVector<double>::operator[](local_18,local_fc);
    iVar2 = local_fc;
    if ((*pdVar6 != 0.0) || (NAN(*pdVar6))) {
      while (local_100 = iVar2 + 1, local_100 < (int)local_5c) {
        local_108 = 0.0;
        for (local_10c = local_fc; dVar8 = local_108, local_10c < (int)local_44;
            local_10c = local_10c + 1) {
          pdVar6 = DMatrix<double>::operator()(local_10,local_10c,local_fc);
          dVar8 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_10,local_10c,local_100);
          local_108 = dVar8 * *pdVar6 + local_108;
        }
        pdVar6 = DMatrix<double>::operator()(local_10,local_fc,local_fc);
        local_108 = -dVar8 / *pdVar6;
        for (local_110 = local_fc; dVar8 = local_108, iVar2 = local_100, local_110 < (int)local_44;
            local_110 = local_110 + 1) {
          pdVar6 = DMatrix<double>::operator()(local_10,local_110,local_fc);
          dVar9 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_10,local_110,local_100);
          *pdVar6 = dVar8 * dVar9 + *pdVar6;
        }
      }
      for (local_114 = local_fc; local_114 < (int)local_44; local_114 = local_114 + 1) {
        pdVar6 = DMatrix<double>::operator()(local_10,local_114,local_fc);
        dVar8 = *pdVar6;
        pdVar6 = DMatrix<double>::operator()(local_10,local_114,local_fc);
        *pdVar6 = -dVar8;
      }
      pdVar6 = DMatrix<double>::operator()(local_10,local_fc,local_fc);
      *pdVar6 = *pdVar6 + 1.0;
      for (local_118 = 0; local_118 < local_fc + -1; local_118 = local_118 + 1) {
        pdVar6 = DMatrix<double>::operator()(local_10,local_118,local_fc);
        *pdVar6 = 0.0;
      }
    }
    else {
      for (local_11c = 0; local_11c < (int)local_44; local_11c = local_11c + 1) {
        pdVar6 = DMatrix<double>::operator()(local_10,local_11c,local_fc);
        *pdVar6 = 0.0;
      }
      pdVar6 = DMatrix<double>::operator()(local_10,local_fc,local_fc);
      *pdVar6 = 1.0;
    }
  }
  while (local_120 = local_120 - 1, -1 < (int)local_120) {
    bVar1 = (int)local_120 < local_94[2];
    pdVar6 = DVector<double>::operator[](&local_70,local_120);
    uVar3 = local_120;
    if (bVar1 && *pdVar6 != 0.0) {
      while (local_124 = uVar3 + 1, (int)local_124 < (int)local_58[0]) {
        local_130 = 0.0;
        local_134 = local_120;
        while (dVar8 = local_130, local_134 = local_134 + 1, (int)local_134 < (int)local_58[0]) {
          pdVar6 = DMatrix<double>::operator()(local_20,local_134,local_120);
          dVar8 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_20,local_134,local_124);
          local_130 = dVar8 * *pdVar6 + local_130;
        }
        pdVar6 = DMatrix<double>::operator()(local_20,local_120 + 1,local_120);
        local_130 = -dVar8 / *pdVar6;
        local_138 = local_120;
        while (dVar8 = local_130, local_138 = local_138 + 1, uVar3 = local_124,
              (int)local_138 < (int)local_58[0]) {
          pdVar6 = DMatrix<double>::operator()(local_20,local_138,local_120);
          dVar9 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_20,local_138,local_124);
          *pdVar6 = dVar8 * dVar9 + *pdVar6;
        }
      }
    }
    for (local_13c = 0; local_13c < (int)local_58[0]; local_13c = local_13c + 1) {
      pdVar6 = DMatrix<double>::operator()(local_20,local_13c,local_120);
      *pdVar6 = 0.0;
    }
    pdVar6 = DMatrix<double>::operator()(local_20,local_120,local_120);
    *pdVar6 = 1.0;
  }
  local_140 = local_ec + -1;
  local_144 = 0;
  local_150 = pow(2.0,-52.0);
  uVar14 = 0;
  uVar15 = 0xc08e3000;
  local_158 = pow(2.0,-966.0);
  local_240 = (double)CONCAT44(uVar15,uVar14);
  do {
    if (local_ec < 1) {
      DVector<double>::~DVector((DVector<double> *)in_stack_fffffffffffff390);
      DVector<double>::~DVector((DVector<double> *)in_stack_fffffffffffff390);
      DMatrix<double>::~DMatrix(in_stack_fffffffffffff390);
      return;
    }
    local_15c = local_ec + -2;
    while( true ) {
      if ((local_15c < -1) || (local_15c == -1)) goto LAB_001ba45f;
      pDVar7 = &local_70;
      DVector<double>::operator[](pDVar7,local_15c);
      std::abs((int)pDVar7);
      dVar9 = local_150;
      dVar8 = local_158;
      pDVar7 = local_18;
      DVector<double>::operator[](local_18,local_15c);
      std::abs((int)pDVar7);
      pDVar7 = local_18;
      DVector<double>::operator[](local_18,local_15c + 1);
      std::abs((int)pDVar7);
      local_240 = extraout_XMM0_Qa;
      if (extraout_XMM0_Qa <= dVar9 * (extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01) + dVar8) break;
      local_15c = local_15c + -1;
    }
    pdVar6 = DVector<double>::operator[](&local_70,local_15c);
    *pdVar6 = 0.0;
LAB_001ba45f:
    iVar2 = local_ec;
    if (local_15c == local_ec + -2) {
      local_160 = 4;
    }
    else {
      do {
        local_164 = iVar2 + -1;
        if ((local_164 < local_15c) || (local_164 == local_15c)) goto LAB_001ba681;
        if (local_164 == local_ec) {
          local_6b8 = 0.0;
        }
        else {
          pDVar7 = &local_70;
          DVector<double>::operator[](pDVar7,local_164);
          std::abs((int)pDVar7);
          local_6b8 = extraout_XMM0_Qa_02;
        }
        if (local_164 == local_15c + 1) {
          local_6d8 = 0.0;
        }
        else {
          pDVar7 = &local_70;
          DVector<double>::operator[](pDVar7,local_164 + -1);
          std::abs((int)pDVar7);
          local_6d8 = extraout_XMM0_Qa_03;
        }
        local_170 = local_6b8 + local_6d8;
        pDVar7 = local_18;
        DVector<double>::operator[](local_18,local_164);
        std::abs((int)pDVar7);
        local_240 = extraout_XMM0_Qa_04;
        iVar2 = local_164;
      } while (local_150 * local_170 + local_158 < extraout_XMM0_Qa_04);
      pdVar6 = DVector<double>::operator[](local_18,local_164);
      *pdVar6 = 0.0;
LAB_001ba681:
      if (local_164 == local_15c) {
        local_160 = 3;
      }
      else if (local_164 == local_ec + -1) {
        local_160 = 1;
      }
      else {
        local_160 = 2;
        local_15c = local_164;
      }
    }
    iVar2 = local_15c;
    local_15c = local_15c + 1;
    switch(local_160) {
    case 1:
      pdVar6 = DVector<double>::operator[](&local_70,local_ec + -2);
      local_178 = *pdVar6;
      pdVar6 = DVector<double>::operator[](&local_70,local_ec + -2);
      *pdVar6 = 0.0;
      for (local_17c = local_ec + -2; local_15c <= local_17c; local_17c = local_17c + -1) {
        DVector<double>::operator[](local_18,local_17c);
        local_188 = anon_unknown_20::hypot(__x_01,local_240);
        pdVar6 = DVector<double>::operator[](local_18,local_17c);
        dVar8 = local_188;
        local_190 = *pdVar6 / local_188;
        uVar14 = SUB84(local_188,0);
        uVar15 = (undefined4)((ulong)local_188 >> 0x20);
        local_198 = local_178 / local_188;
        pdVar6 = DVector<double>::operator[](local_18,local_17c);
        *pdVar6 = dVar8;
        if (local_17c != local_15c) {
          dVar8 = -local_198;
          pdVar6 = DVector<double>::operator[](&local_70,local_17c + -1);
          dVar9 = local_190;
          local_178 = dVar8 * *pdVar6;
          pdVar6 = DVector<double>::operator[](&local_70,local_17c + -1);
          dVar8 = *pdVar6;
          uVar14 = SUB84(dVar8,0);
          uVar15 = (undefined4)((ulong)dVar8 >> 0x20);
          pdVar6 = DVector<double>::operator[](&local_70,local_17c + -1);
          *pdVar6 = dVar9 * dVar8;
        }
        local_240 = (double)CONCAT44(uVar15,uVar14);
        for (local_19c = 0; dVar8 = local_190, local_19c < (int)local_58[0];
            local_19c = local_19c + 1) {
          pdVar6 = DMatrix<double>::operator()(local_20,local_19c,local_17c);
          dVar10 = local_198;
          dVar9 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_20,local_19c,local_ec + -1);
          local_188 = dVar8 * dVar9 + dVar10 * *pdVar6;
          dVar9 = -local_198;
          pdVar6 = DMatrix<double>::operator()(local_20,local_19c,local_17c);
          local_240 = local_190;
          dVar8 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_20,local_19c,local_ec + -1);
          local_240 = local_240 * *pdVar6;
          dVar9 = dVar9 * dVar8 + local_240;
          pdVar6 = DMatrix<double>::operator()(local_20,local_19c,local_ec + -1);
          dVar8 = local_188;
          *pdVar6 = dVar9;
          pdVar6 = DMatrix<double>::operator()(local_20,local_19c,local_17c);
          *pdVar6 = dVar8;
        }
      }
      break;
    case 2:
      pdVar6 = DVector<double>::operator[](&local_70,iVar2);
      local_1a8 = *pdVar6;
      pdVar6 = DVector<double>::operator[](&local_70,local_15c + -1);
      *pdVar6 = 0.0;
      for (local_1ac = local_15c; local_1ac < local_ec; local_1ac = local_1ac + 1) {
        DVector<double>::operator[](local_18,local_1ac);
        local_1b8 = anon_unknown_20::hypot(__x_02,local_240);
        pdVar6 = DVector<double>::operator[](local_18,local_1ac);
        dVar8 = local_1b8;
        local_1c0 = *pdVar6 / local_1b8;
        local_1c8 = local_1a8 / local_1b8;
        pdVar6 = DVector<double>::operator[](local_18,local_1ac);
        *pdVar6 = dVar8;
        dVar8 = -local_1c8;
        pdVar6 = DVector<double>::operator[](&local_70,local_1ac);
        dVar9 = local_1c0;
        local_1a8 = dVar8 * *pdVar6;
        pdVar6 = DVector<double>::operator[](&local_70,local_1ac);
        dVar8 = *pdVar6;
        uVar14 = SUB84(dVar8,0);
        uVar15 = (undefined4)((ulong)dVar8 >> 0x20);
        pdVar6 = DVector<double>::operator[](&local_70,local_1ac);
        local_240 = (double)CONCAT44(uVar15,uVar14);
        *pdVar6 = dVar9 * dVar8;
        for (local_1cc = 0; dVar8 = local_1c0, local_1cc < (int)local_44; local_1cc = local_1cc + 1)
        {
          pdVar6 = DMatrix<double>::operator()(local_10,local_1cc,local_1ac);
          dVar10 = local_1c8;
          dVar9 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_10,local_1cc,local_15c + -1);
          local_1b8 = dVar8 * dVar9 + dVar10 * *pdVar6;
          dVar9 = -local_1c8;
          pdVar6 = DMatrix<double>::operator()(local_10,local_1cc,local_1ac);
          local_240 = local_1c0;
          dVar8 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_10,local_1cc,local_15c + -1);
          local_240 = local_240 * *pdVar6;
          dVar9 = dVar9 * dVar8 + local_240;
          pdVar6 = DMatrix<double>::operator()(local_10,local_1cc,local_15c + -1);
          dVar8 = local_1b8;
          *pdVar6 = dVar9;
          pdVar6 = DMatrix<double>::operator()(local_10,local_1cc,local_1ac);
          *pdVar6 = dVar8;
        }
      }
      break;
    case 3:
      pDVar7 = local_18;
      DVector<double>::operator[](local_18,local_ec + -1);
      std::abs((int)pDVar7);
      pDVar7 = local_18;
      DVector<double>::operator[](local_18,local_ec + -2);
      std::abs((int)pDVar7);
      pdVar6 = std::max<double>(&local_1e0,&local_1e8);
      pDVar7 = &local_70;
      DVector<double>::operator[](pDVar7,local_ec + -2);
      std::abs((int)pDVar7);
      pdVar6 = std::max<double>(pdVar6,&local_1f0);
      pDVar7 = local_18;
      DVector<double>::operator[](local_18,local_15c);
      std::abs((int)pDVar7);
      pdVar6 = std::max<double>(pdVar6,&local_1f8);
      pDVar7 = &local_70;
      DVector<double>::operator[](pDVar7,local_15c);
      std::abs((int)pDVar7);
      pdVar6 = std::max<double>(pdVar6,&local_200);
      local_1d8 = *pdVar6;
      pdVar6 = DVector<double>::operator[](local_18,local_ec + -1);
      dVar9 = *pdVar6 / local_1d8;
      pdVar6 = DVector<double>::operator[](local_18,local_ec + -2);
      dVar10 = *pdVar6 / local_1d8;
      pdVar6 = DVector<double>::operator[](&local_70,local_ec + -2);
      dVar11 = *pdVar6 / local_1d8;
      pdVar6 = DVector<double>::operator[](local_18,local_15c);
      dVar8 = *pdVar6 / local_1d8;
      pdVar6 = DVector<double>::operator[](&local_70,local_15c);
      dVar12 = *pdVar6 / local_1d8;
      dVar10 = ((dVar10 + dVar9) * (dVar10 - dVar9) + dVar11 * dVar11) / 2.0;
      dVar11 = dVar9 * dVar11 * dVar9 * dVar11;
      local_240 = 0.0;
      if (dVar10 != 0.0 || dVar11 != 0.0) {
        local_240 = sqrt(dVar10 * dVar10 + dVar11);
        if (dVar10 < 0.0) {
          local_240 = -local_240;
        }
        local_240 = dVar11 / (dVar10 + local_240);
      }
      local_248 = (dVar8 + dVar9) * (dVar8 - dVar9) + local_240;
      dVar8 = dVar8 * dVar12;
      local_250 = dVar8;
      for (local_254 = local_15c; local_254 < local_ec + -1; local_254 = local_254 + 1) {
        dVar8 = anon_unknown_20::hypot(dVar8,local_240);
        local_248 = local_248 / dVar8;
        local_250 = local_250 / dVar8;
        if (local_254 != local_15c) {
          pdVar6 = DVector<double>::operator[](&local_70,local_254 + -1);
          *pdVar6 = dVar8;
        }
        pdVar6 = DVector<double>::operator[](local_18,local_254);
        dVar8 = *pdVar6;
        pdVar6 = DVector<double>::operator[](&local_70,local_254);
        dVar9 = *pdVar6;
        pdVar6 = DVector<double>::operator[](&local_70,local_254);
        dVar10 = *pdVar6;
        pdVar6 = DVector<double>::operator[](local_18,local_254);
        dVar11 = *pdVar6;
        pdVar6 = DVector<double>::operator[](&local_70,local_254);
        *pdVar6 = local_248 * dVar10 - local_250 * dVar11;
        pdVar6 = DVector<double>::operator[](local_18,local_254 + 1);
        dVar10 = *pdVar6;
        pdVar6 = DVector<double>::operator[](local_18,local_254 + 1);
        dVar11 = *pdVar6;
        uVar14 = SUB84(dVar11,0);
        uVar15 = (undefined4)((ulong)dVar11 >> 0x20);
        dVar11 = local_248 * dVar11;
        pdVar6 = DVector<double>::operator[](local_18,local_254 + 1);
        dVar12 = (double)CONCAT44(uVar15,uVar14);
        *pdVar6 = dVar11;
        for (local_274 = 0; local_274 < (int)local_58[0]; local_274 = local_274 + 1) {
          pdVar6 = DMatrix<double>::operator()(local_20,local_274,local_254);
          dVar11 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_20,local_274,local_254 + 1);
          dVar11 = local_248 * dVar11 + local_250 * *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_20,local_274,local_254);
          dVar13 = *pdVar6;
          pdVar6 = DMatrix<double>::operator()(local_20,local_274,local_254 + 1);
          dVar12 = local_248 * *pdVar6;
          dVar13 = -local_250 * dVar13 + dVar12;
          pdVar6 = DMatrix<double>::operator()(local_20,local_274,local_254 + 1);
          *pdVar6 = dVar13;
          pdVar6 = DMatrix<double>::operator()(local_20,local_274,local_254);
          *pdVar6 = dVar11;
        }
        dVar11 = anon_unknown_20::hypot(dVar11,dVar12);
        dVar12 = (local_248 * dVar8 + local_250 * dVar9) / dVar11;
        dVar10 = (local_250 * dVar10) / dVar11;
        pdVar6 = DVector<double>::operator[](local_18,local_254);
        *pdVar6 = dVar11;
        pdVar6 = DVector<double>::operator[](&local_70,local_254);
        dVar8 = *pdVar6;
        pdVar6 = DVector<double>::operator[](local_18,local_254 + 1);
        local_248 = dVar12 * dVar8 + dVar10 * *pdVar6;
        pdVar6 = DVector<double>::operator[](&local_70,local_254);
        dVar8 = *pdVar6;
        pdVar6 = DVector<double>::operator[](local_18,local_254 + 1);
        dVar9 = *pdVar6;
        pdVar6 = DVector<double>::operator[](local_18,local_254 + 1);
        *pdVar6 = -dVar10 * dVar8 + dVar12 * dVar9;
        pdVar6 = DVector<double>::operator[](&local_70,local_254 + 1);
        local_250 = dVar10 * *pdVar6;
        pdVar6 = DVector<double>::operator[](&local_70,local_254 + 1);
        dVar8 = *pdVar6;
        uVar14 = SUB84(dVar8,0);
        uVar15 = (undefined4)((ulong)dVar8 >> 0x20);
        dVar8 = dVar12 * dVar8;
        pdVar6 = DVector<double>::operator[](&local_70,local_254 + 1);
        local_240 = (double)CONCAT44(uVar15,uVar14);
        *pdVar6 = dVar8;
        if (local_254 < (int)(local_44 - 1)) {
          for (local_278 = 0; local_278 < (int)local_44; local_278 = local_278 + 1) {
            pdVar6 = DMatrix<double>::operator()(local_10,local_278,local_254);
            dVar8 = *pdVar6;
            pdVar6 = DMatrix<double>::operator()(local_10,local_278,local_254 + 1);
            dVar8 = dVar12 * dVar8 + dVar10 * *pdVar6;
            pdVar6 = DMatrix<double>::operator()(local_10,local_278,local_254);
            dVar9 = *pdVar6;
            pdVar6 = DMatrix<double>::operator()(local_10,local_278,local_254 + 1);
            local_240 = dVar12 * *pdVar6;
            dVar9 = -dVar10 * dVar9 + local_240;
            pdVar6 = DMatrix<double>::operator()(local_10,local_278,local_254 + 1);
            *pdVar6 = dVar9;
            pdVar6 = DMatrix<double>::operator()(local_10,local_278,local_254);
            *pdVar6 = dVar8;
          }
        }
      }
      pdVar6 = DVector<double>::operator[](&local_70,local_ec + -2);
      *pdVar6 = local_248;
      local_144 = local_144 + 1;
      break;
    case 4:
      pdVar6 = DVector<double>::operator[](local_18,local_15c);
      if (*pdVar6 <= 0.0) {
        pdVar6 = DVector<double>::operator[](local_18,local_15c);
        if (0.0 < *pdVar6 || *pdVar6 == 0.0) {
          local_ba0 = 0.0;
        }
        else {
          pdVar6 = DVector<double>::operator[](local_18,local_15c);
          local_ba0 = -*pdVar6;
        }
        pdVar6 = DVector<double>::operator[](local_18,local_15c);
        *pdVar6 = local_ba0;
        for (local_27c = 0; local_27c < (int)local_58[0]; local_27c = local_27c + 1) {
          pdVar6 = DMatrix<double>::operator()(local_20,local_27c,local_15c);
          dVar8 = *pdVar6;
          uVar14 = 0;
          uVar15 = 0x80000000;
          pdVar6 = DMatrix<double>::operator()(local_20,local_27c,local_15c);
          local_240 = (double)CONCAT44(uVar15,uVar14);
          *pdVar6 = -dVar8;
        }
      }
      for (; local_15c < local_140; local_15c = local_15c + 1) {
        pdVar6 = DVector<double>::operator[](local_18,local_15c);
        dVar8 = *pdVar6;
        pdVar6 = DVector<double>::operator[](local_18,local_15c + 1);
        if (*pdVar6 <= dVar8) break;
        pdVar6 = DVector<double>::operator[](local_18,local_15c);
        dVar8 = *pdVar6;
        pdVar6 = DVector<double>::operator[](local_18,local_15c + 1);
        dVar9 = *pdVar6;
        pdVar6 = DVector<double>::operator[](local_18,local_15c);
        *pdVar6 = dVar9;
        pdVar6 = DVector<double>::operator[](local_18,local_15c + 1);
        *pdVar6 = dVar8;
        if (local_15c < (int)(local_58[0] - 1)) {
          for (local_28c = 0; local_28c < (int)local_58[0]; local_28c = local_28c + 1) {
            pdVar6 = DMatrix<double>::operator()(local_20,local_28c,local_15c + 1);
            dVar8 = *pdVar6;
            pdVar6 = DMatrix<double>::operator()(local_20,local_28c,local_15c);
            dVar9 = *pdVar6;
            pdVar6 = DMatrix<double>::operator()(local_20,local_28c,local_15c + 1);
            *pdVar6 = dVar9;
            pdVar6 = DMatrix<double>::operator()(local_20,local_28c,local_15c);
            *pdVar6 = dVar8;
          }
        }
        if (local_15c < (int)(local_44 - 1)) {
          for (local_290 = 0; local_290 < (int)local_44; local_290 = local_290 + 1) {
            pdVar6 = DMatrix<double>::operator()(local_10,local_290,local_15c + 1);
            in_stack_fffffffffffff390 = (DMatrix<double> *)*pdVar6;
            pdVar6 = DMatrix<double>::operator()(local_10,local_290,local_15c);
            dVar8 = *pdVar6;
            pdVar6 = DMatrix<double>::operator()(local_10,local_290,local_15c + 1);
            *pdVar6 = dVar8;
            pdVar6 = DMatrix<double>::operator()(local_10,local_290,local_15c);
            *pdVar6 = (double)in_stack_fffffffffffff390;
          }
        }
      }
      local_144 = 0;
      local_ec = local_ec + -1;
    }
  } while( true );
}

Assistant:

void svd(const Matrixd &a, Matrixd &U, Vectord &W, Matrixd &V, bool thin)
{
  const bool wantu=true;
  const bool wantv=true;

  Matrixd A(a);

  const int m=A.rows();
  const int n=A.cols();
  const int ncu=thin?std::min(m, n):m;

  U.init(m, ncu); U=0;
  W.init(std::min(m+1, n));
  V.init(n, n); V=0;

  Vectord e(n);
  Vectord work(m);

  // Reduce A to bidiagonal form, storing the diagonal elements
  // in W and the super-diagonal elements in e.

  int nct=std::min(m-1, n);
  int nrt=std::max(0, std::min(n-2, m));
  int lu=std::max(nct, nrt);

  for (int k=0; k<lu; k++)
  {
    if (k < nct)
    {
      // Compute the transformation for the k-th column and
      // place the k-th diagonal in W[k].
      // Compute 2-norm of k-th column without under/overflow.

      W[k]=0;

      for (int i=k; i<m; i++)
      {
        W[k]=hypot(W[k], A(i, k));
      }

      if (W[k] != 0.0)
      {
        if (A(k, k) < 0.0)
        {
          W[k]=-W[k];
        }

        for (int i=k; i<m; i++)
        {
          A(i, k)/=W[k];
        }

        A(k, k)+=1.0;
      }

      W[k]=-W[k];
    }

    for (int j=k+1; j<n; j++)
    {
      if ((k < nct) & (W[k] != 0.0))
      {
        // Apply the transformation.

        double t=0;

        for (int i=k; i<m; i++)
        {
          t+=A(i, k)*A(i, j);
        }

        t=-t/A(k, k);

        for (int i=k; i<m; i++)
        {
          A(i, j)+=t*A(i, k);
        }
      }

      // Place the k-th row of A into e for the
      // subsequent calculation of the row transformation.

      e[j]=A(k, j);
    }

    if (wantu & (k < nct))
    {
      // Place the transformation in U for subsequent back
      // multiplication.

      for (int i=k; i<m; i++)
      {
        U(i, k)=A(i, k);
      }
    }

    if (k < nrt)
    {
      // Compute the k-th row transformation and place the
      // k-th super-diagonal in e[k].
      // Compute 2-norm without under/overflow.

      e[k]=0;

      for (int i=k+1; i<n; i++)
      {
        e[k]=hypot(e[k], e[i]);
      }

      if (e[k] != 0.0)
      {
        if (e[k+1] < 0.0)
        {
          e[k]=-e[k];
        }

        for (int i=k+1; i<n; i++)
        {
          e[i]/=e[k];
        }

        e[k+1]+=1.0;
      }

      e[k]=-e[k];

      if ((k+1 < m) & (e[k] != 0.0))
      {
        // Apply the transformation.

        for (int i=k+1; i<m; i++)
        {
          work[i]=0.0;
        }

        for (int j=k+1; j<n; j++)
        {
          for (int i=k+1; i<m; i++)
          {
            work[i]+=e[j]*A(i, j);
          }
        }

        for (int j=k+1; j<n; j++)
        {
          double t=-e[j]/e[k+1];

          for (int i=k+1; i<m; i++)
          {
            A(i, j)+=t*work[i];
          }
        }
      }

      if (wantv)
      {
        // Place the transformation in V for subsequent
        // back multiplication.

        for (int i=k+1; i<n; i++)
        {
          V(i, k)=e[i];
        }
      }
    }
  }

  // Set up the final bidiagonal matrix or order p.

  int p=std::min(n, m+1);

  if (nct < n)
  {
    W[nct]=A(nct, nct);
  }

  if (m < p)
  {
    W[p-1]=0.0;
  }

  if (nrt+1 < p)
  {
    e[nrt]=A(nrt, p-1);
  }

  e[p-1]=0.0;

  // If required, generate U.

  if (wantu)
  {
    for (int j=nct; j<ncu; j++)
    {
      for (int i=0; i<m; i++)
      {
        U(i, j)=0.0;
      }

      U(j, j)=1.0;
    }

    for (int k=nct-1; k>=0; k--)
    {
      if (W[k] != 0.0)
      {
        for (int j=k+1; j<ncu; j++)
        {
          double t=0;

          for (int i=k; i<m; i++)
          {
            t+=U(i, k)*U(i, j);
          }

          t=-t/U(k, k);

          for (int i=k; i<m; i++)
          {
            U(i, j)+=t*U(i, k);
          }
        }

        for (int i=k; i<m; i++)
        {
          U(i, k)=-U(i, k);
        }

        U(k, k)+=1.0;

        for (int i=0; i<k-1; i++)
        {
          U(i, k)=0.0;
        }
      }
      else
      {
        for (int i=0; i<m; i++)
        {
          U(i, k)=0.0;
        }

        U(k, k)=1.0;
      }
    }
  }

  // If required, generate V.

  if (wantv)
  {
    for (int k=n-1; k>=0; k--)
    {
      if ((k < nrt) & (e[k] != 0.0))
      {
        for (int j=k+1; j<n; j++)
        {
          double t=0;

          for (int i=k+1; i<n; i++)
          {
            t+=V(i, k)*V(i, j);
          }

          t=-t/V(k+1, k);

          for (int i=k+1; i<n; i++)
          {
            V(i, j)+=t*V(i, k);
          }
        }
      }

      for (int i=0; i<n; i++)
      {
        V(i, k)=0.0;
      }

      V(k, k)=1.0;
    }
  }

  // Main iteration loop for the singular values.

  int pp=p-1;
  int iter=0;
  double eps=pow(2.0,-52.0);
  double tiny=pow(2.0,-966.0);

  while (p > 0)
  {
    int k, kase;

    // Here is where a test for too many iterations would go.

    // This section of the program inspects for
    // negligible elements in the s and e arrays. On
    // completion the variables kase and k are set as follows.

    // kase = 1     if s(p) and e[k-1] are negligible and k<p
    // kase = 2     if s(k) is negligible and k<p
    // kase = 3     if e[k-1] is negligible, k<p, and
    //              s(k), ..., s(p) are not negligible (qr step).
    // kase = 4     if e(p-1) is negligible (convergence).

    for (k=p-2; k>=-1; k--)
    {
      if (k == -1)
      {
        break;
      }

      if (std::abs(e[k]) <= tiny+eps*(std::abs(W[k])+std::abs(W[k+1])))
      {
        e[k]=0.0;
        break;
      }
    }

    if (k == p-2)
    {
      kase=4;
    }
    else
    {
      int ks;

      for (ks=p-1; ks>=k; ks--)
      {
        if (ks == k)
        {
          break;
        }

        double t=(ks != p ? std::abs(e[ks]) : 0.) +
                 (ks != k+1 ? std::abs(e[ks-1]) : 0.);

        if (std::abs(W[ks]) <= tiny+eps*t)
        {
          W[ks]=0.0;
          break;
        }
      }

      if (ks == k)
      {
        kase=3;
      }
      else if (ks == p-1)
      {
        kase=1;
      }
      else
      {
        kase=2;
        k=ks;
      }
    }

    k++;

    // Perform the task indicated by kase.

    switch (kase)
    {

        // Deflate negligible s(p).

      case 1:
        {
          double f=e[p-2];
          e[p-2]=0.0;

          for (int j=p-2; j>=k; j--)
          {
            double t=hypot(W[j],f);
            double cs=W[j]/t;
            double sn=f/t;
            W[j]=t;

            if (j != k)
            {
              f=-sn*e[j-1];
              e[j-1]=cs*e[j-1];
            }

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                t=cs*V(i, j)+sn*V(i, p-1);
                V(i, p-1)=-sn*V(i, j)+cs*V(i, p-1);
                V(i, j)=t;
              }
            }
          }
        }
        break;

        // Split at negligible s(k).

      case 2:
        {
          double f=e[k-1];
          e[k-1]=0.0;

          for (int j=k; j<p; j++)
          {
            double t=hypot(W[j],f);
            double cs=W[j]/t;
            double sn=f/t;
            W[j]=t;
            f=-sn*e[j];
            e[j]=cs*e[j];

            if (wantu)
            {
              for (int i=0; i<m; i++)
              {
                t=cs*U(i, j)+sn*U(i, k-1);
                U(i, k-1)=-sn*U(i, j)+cs*U(i, k-1);
                U(i, j)=t;
              }
            }
          }
        }
        break;

        // Perform one qr step.

      case 3:
        {

          // Calculate the shift.

          double scale=std::max(std::max(std::max(std::max(std::abs(W[p-1]), std::abs(W[p-2])),
                                                  std::abs(e[p-2])), std::abs(W[k])), std::abs(e[k]));
          double sp=W[p-1]/scale;
          double spm1=W[p-2]/scale;
          double epm1=e[p-2]/scale;
          double sk=W[k]/scale;
          double ek=e[k]/scale;
          double b=((spm1+sp)*(spm1-sp)+epm1*epm1)/2.0;
          double c=(sp*epm1)*(sp*epm1);
          double shift=0.0;

          if ((b != 0.0) | (c != 0.0))
          {
            shift=sqrt(b*b + c);

            if (b < 0.0)
            {
              shift=-shift;
            }

            shift=c/(b + shift);
          }

          double f=(sk + sp)*(sk - sp) + shift;
          double g=sk*ek;

          // Chase zeros.

          for (int j=k; j<p-1; j++)
          {
            double t=hypot(f, g);
            double cs=f/t;
            double sn=g/t;

            if (j != k)
            {
              e[j-1]=t;
            }

            f=cs*W[j]+sn*e[j];
            e[j]=cs*e[j]-sn*W[j];
            g=sn*W[j+1];
            W[j+1]=cs*W[j+1];

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                t=cs*V(i, j)+sn*V(i, j+1);
                V(i, j+1)=-sn*V(i, j)+cs*V(i, j+1);
                V(i, j)=t;
              }
            }

            t=hypot(f,g);
            cs=f/t;
            sn=g/t;
            W[j]=t;
            f=cs*e[j]+sn*W[j+1];
            W[j+1]=-sn*e[j]+cs*W[j+1];
            g=sn*e[j+1];
            e[j+1]=cs*e[j+1];

            if (wantu && (j < m-1))
            {
              for (int i=0; i<m; i++)
              {
                t=cs*U(i, j)+sn*U(i, j+1);
                U(i, j+1)=-sn*U(i, j)+cs*U(i, j+1);
                U(i, j)=t;
              }
            }
          }

          e[p-2]=f;
          iter++;
        }
        break;

        // Convergence.

      case 4:
        {

          // Make the singular values positive.

          if (W[k] <= 0.0)
          {
            W[k]=(W[k] < 0.0 ? -W[k] : 0.0);

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                V(i, k)=-V(i, k);
              }
            }
          }

          // Order the singular values.

          while (k < pp)
          {
            if (W[k] >= W[k+1])
            {
              break;
            }

            double t=W[k];
            W[k]=W[k+1];
            W[k+1]=t;

            if (wantv && (k < n-1))
            {
              for (int i=0; i<n; i++)
              {
                t=V(i, k+1);
                V(i, k+1)=V(i, k);
                V(i, k)=t;
              }
            }

            if (wantu && (k < m-1))
            {
              for (int i=0; i<m; i++)
              {
                t=U(i, k+1);
                U(i, k+1)=U(i, k);
                U(i, k)=t;
              }
            }

            k++;
          }

          iter=0;
          p--;
        }
        break;
    }
  }
}